

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

vector<QPDFExc,_std::allocator<QPDFExc>_> * __thiscall
QPDF::getWarnings(vector<QPDFExc,_std::allocator<QPDFExc>_> *__return_storage_ptr__,QPDF *this)

{
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::vector
            (__return_storage_ptr__,
             &((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->warnings);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::clear
            (&((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->warnings);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFExc>
QPDF::getWarnings()
{
    std::vector<QPDFExc> result = m->warnings;
    m->warnings.clear();
    return result;
}